

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ElementPIndexed
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 scopeIndex,uint cacheId)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  uint uStack_20;
  bool success;
  uint32 local_1c;
  uint cacheId_local;
  uint32 scopeIndex_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_20 = cacheId;
  local_1c = scopeIndex;
  cacheId_local = value;
  scopeIndex_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = scopeIndex_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,ElementPIndexed);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(scopeIndex_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x805,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  cacheId_local = ConsumeReg(this,cacheId_local);
  if (((scopeIndex_local._2_2_ != InitUndeclLetFld) &&
      (scopeIndex_local._2_2_ != InitUndeclConstFld)) &&
     (scopeIndex_local._2_2_ != InitInnerFld && scopeIndex_local._2_2_ != InitInnerLetFld)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x813,"(false)",
                                "The specified OpCode not intended for base-less patchable inner field access"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,scopeIndex_local._2_2_,cacheId_local,local_1c,uStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,scopeIndex_local._2_2_,cacheId_local,local_1c,uStack_20), !bVar2)) &&
     (bVar2 = TryWriteElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,scopeIndex_local._2_2_,cacheId_local,local_1c,uStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x817,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ElementPIndexed(OpCode op, RegSlot value, uint32 scopeIndex, uint cacheId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementPIndexed);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        switch (op)
        {
        case OpCode::InitInnerFld:
        case OpCode::InitInnerLetFld:
        case OpCode::InitUndeclLetFld:
        case OpCode::InitUndeclConstFld:
            break;

            break;

        default:
            AssertMsg(false, "The specified OpCode not intended for base-less patchable inner field access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementPIndexed, op, value, scopeIndex, cacheId);
    }